

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O1

void Gia_ManHighlight_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)iObj;
  while( true ) {
    iVar4 = (int)uVar5;
    if (p->nTravIdsAlloc <= iVar4) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[iVar4] == p->nTravIds) {
      return;
    }
    p->pTravIds[iVar4] = p->nTravIds;
    if ((iVar4 < 0) || (p->nObjs <= iVar4)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pObjs;
    uVar3 = (uint)*(undefined8 *)(pGVar1 + uVar5);
    if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
      Gia_ManHighlight_rec(p,iVar4 - (uVar3 & 0x1fffffff));
    }
    uVar2 = *(undefined8 *)(pGVar1 + uVar5);
    uVar3 = (uint)uVar2;
    if ((int)uVar3 < 0) break;
    if ((uVar3 & 0x1fffffff) == 0x1fffffff) {
      return;
    }
    uVar5 = (ulong)(iVar4 - ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff));
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManHighlight_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId1(pObj, iObj) );
}